

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O2

bool __thiscall Reducer::tryToReduceCurrentToUnreachable(Reducer *this)

{
  bool bVar1;
  Expression *expression;
  undefined1 local_28 [8];
  Unreachable un;
  
  if ((*(this->
        super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
        ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
        super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.replacep)->_id ==
      UnreachableId) {
    bVar1 = false;
  }
  else {
    local_28._0_4_ = UnreachableId;
    un.super_SpecificExpression<(wasm::Expression::Id)23>.super_Expression._id = BlockId;
    un.super_SpecificExpression<(wasm::Expression::Id)23>.super_Expression._4_4_ = 0;
    bVar1 = tryToReplaceCurrent(this,(Expression *)local_28);
    if (bVar1) {
      expression = (Expression *)
                   wasm::Builder::makeUnreachable
                             ((this->builder)._M_t.
                              super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                              .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl);
      wasm::Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::replaceCurrent
                (&(this->
                  super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                  ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                  super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,expression);
    }
  }
  return bVar1;
}

Assistant:

bool tryToReduceCurrentToUnreachable() {
    auto* curr = getCurrent();
    if (curr->is<Unreachable>()) {
      return false;
    }
    // try to replace with a trivial value
    Unreachable un;
    if (tryToReplaceCurrent(&un)) {
      replaceCurrent(builder->makeUnreachable());
      return true;
    }
    // maybe a return? TODO
    return false;
  }